

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliCreateZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  size_t max_backward_limit_00;
  size_t sVar1;
  ZopfliNode *local_58;
  ZopfliNode *nodes;
  size_t max_backward_limit;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  
  max_backward_limit_00 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0xffffffffffffffff) {
    local_58 = (ZopfliNode *)0x0;
  }
  else {
    local_58 = (ZopfliNode *)BrotliAllocate(m,(num_bytes + 1) * 0x10);
  }
  BrotliInitZopfliNodes(local_58,num_bytes + 1);
  sVar1 = BrotliZopfliComputeShortestPath
                    (m,num_bytes,position,ringbuffer,ringbuffer_mask,params,max_backward_limit_00,
                     dist_cache,hasher,local_58);
  *num_commands = sVar1 + *num_commands;
  BrotliZopfliCreateCommands
            (num_bytes,position,max_backward_limit_00,local_58,dist_cache,last_insert_len,params,
             commands,num_literals);
  BrotliFree(m,local_58);
  return;
}

Assistant:

void BrotliCreateZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  ZopfliNode* nodes;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  BrotliInitZopfliNodes(nodes, num_bytes + 1);
  *num_commands += BrotliZopfliComputeShortestPath(m,
      num_bytes, position, ringbuffer, ringbuffer_mask,
      params, max_backward_limit, dist_cache, hasher, nodes);
  if (BROTLI_IS_OOM(m)) return;
  BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit, nodes,
      dist_cache, last_insert_len, params, commands, num_literals);
  BROTLI_FREE(m, nodes);
}